

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# golf.c
# Opt level: O3

void golf_update(float dt)

{
  golf_data_load_state_t gVar1;
  
  switch(golf._0_8_ & 0xffffffff) {
  case 0:
    golf.field_1 = (anon_union_4_4_5060af42_for_golf_1)((float)golf.field_1 + dt);
    gVar1 = golf_data_get_load_state(golf.level_loading_path);
    if (gVar1 == GOLF_DATA_LOADED) {
      golf.level = golf_data_get_level(golf.level_loading_path);
      ui->field_0 = (anon_union_1_1_069efac5_for_golf_ui_0)0x0;
      golf.state = GOLF_STATE_MAIN_MENU;
      golf.field_1 = (anon_union_4_4_5060af42_for_golf_1)0x0;
      golf_game_start_main_menu();
    }
    break;
  case 1:
  case 3:
    golf.field_1 = (anon_union_4_4_5060af42_for_golf_1)((float)golf.field_1 + dt);
    break;
  case 2:
    golf.field_1 = (anon_union_4_4_5060af42_for_golf_1)((float)golf.field_1 + dt);
    gVar1 = golf_data_get_load_state(golf.level_loading_path);
    if (gVar1 == GOLF_DATA_LOADED) {
      golf.level = golf_data_get_level(golf.level_loading_path);
      golf.state = GOLF_STATE_IN_GAME;
      golf.field_1 = (anon_union_4_4_5060af42_for_golf_1)0x0;
      golf_game_start_level();
    }
  }
  if ((golf.state & ~GOLF_STATE_LOADING_LEVEL) == GOLF_STATE_MAIN_MENU) {
    golf_game_update(dt);
  }
  golf_ui_update(dt);
  golf_debug_console_update(dt);
  golf_audio_update(dt);
  return;
}

Assistant:

void golf_update(float dt) {
    switch (golf.state) {
        case GOLF_STATE_TITLE_SCREEN: {
            golf.title_screen.t += dt;
            if (golf_data_get_load_state(golf.level_loading_path) == GOLF_DATA_LOADED) {
                golf.level = golf_data_get_level(golf.level_loading_path);
                golf_goto_main_menu(); 
            }
            break;
        }
        case GOLF_STATE_MAIN_MENU: {
            golf.main_menu.t += dt;
            break;
        }
        case GOLF_STATE_LOADING_LEVEL: {
            golf.loading_level.t += dt;
            if (golf_data_get_load_state(golf.level_loading_path) == GOLF_DATA_LOADED) {
                golf.level = golf_data_get_level(golf.level_loading_path);
                golf.state = GOLF_STATE_IN_GAME;
                golf.in_game.t = 0;
                golf_game_start_level();
            }
            break;
        }
        case GOLF_STATE_IN_GAME: {
            golf.in_game.t += dt;
            break;
        }
    }

    if (golf.state == GOLF_STATE_MAIN_MENU || golf.state == GOLF_STATE_IN_GAME) {
        golf_game_update(dt);
    }
    golf_ui_update(dt);
    golf_debug_console_update(dt);
    golf_audio_update(dt);
}